

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformField.cpp
# Opt level: O0

void __thiscall OpenMD::UniformField::modifyForces(UniformField *this)

{
  bool bVar1;
  SnapshotManager *pSVar2;
  Snapshot *this_00;
  double *pdVar3;
  iterator *in_RDI;
  RealType RVar4;
  Snapshot *snap;
  MultipoleAdapter ma;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  bool isCharge;
  Vector3d r;
  Vector3d f;
  Vector3d t;
  RealType fPot;
  RealType U;
  Vector3d D;
  RealType C;
  potVec longRangePotential;
  AtomType *atype;
  Atom *atom;
  Molecule *mol;
  AtomIterator j;
  MoleculeIterator i;
  Snapshot *in_stack_fffffffffffffd98;
  potVec *lrPot;
  StuntDouble *in_stack_fffffffffffffda0;
  Atom *in_stack_fffffffffffffda8;
  Atom *in_stack_fffffffffffffdb0;
  SimInfo *in_stack_fffffffffffffdc0;
  Vector3<double> *in_stack_fffffffffffffe00;
  Vector3<double> *in_stack_fffffffffffffe08;
  Vector3d *in_stack_fffffffffffffe18;
  Snapshot *in_stack_fffffffffffffe20;
  UniformField *in_stack_fffffffffffffe50;
  MultipoleAdapter local_180 [7];
  FluctuatingChargeAdapter local_148;
  FixedChargeAdapter local_140 [10];
  byte local_e9;
  potVec *local_a0;
  double local_98;
  RealType local_78;
  double local_70;
  Vector<double,_7U> local_68;
  AtomType *local_30;
  Atom *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  if (((ulong)in_RDI[2]._M_current & 1) == 0) {
    initialize(in_stack_fffffffffffffe50);
  }
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_18);
  local_70 = 0.0;
  Vector<double,_7U>::Vector(&local_68,&local_70);
  Vector3<double>::Vector3((Vector3<double> *)0x1b1e04);
  Vector3<double>::Vector3((Vector3<double> *)0x1b1e11);
  Vector3<double>::Vector3((Vector3<double> *)0x1b1e1e);
  Vector3<double>::Vector3((Vector3<double> *)0x1b1e2b);
  if (((ulong)in_RDI[2]._M_current & 0x100) != 0) {
    local_98 = 0.0;
    local_a0 = (potVec *)0x0;
    local_20 = SimInfo::beginMolecule(in_stack_fffffffffffffdc0,(MoleculeIterator *)in_RDI);
    while (local_20 != (Molecule *)0x0) {
      local_28 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffffdc0,in_RDI);
      while (local_28 != (Atom *)0x0) {
        local_e9 = 0;
        local_78 = 0.0;
        local_30 = Atom::getAtomType(local_28);
        StuntDouble::getPos(&in_stack_fffffffffffffda8->super_StuntDouble);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffda0,
                   (Vector3<double> *)in_stack_fffffffffffffd98);
        pSVar2 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]._M_current);
        SnapshotManager::getCurrentSnapshot(pSVar2);
        Snapshot::wrapVector(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        in_stack_fffffffffffffdb0 = local_28;
        OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffda8,
                          (double)in_stack_fffffffffffffda0);
        Vector3<double>::Vector3
                  ((Vector3<double> *)in_stack_fffffffffffffda0,
                   (Vector<double,_3U> *)in_stack_fffffffffffffd98);
        StuntDouble::addElectricField
                  (&in_stack_fffffffffffffdb0->super_StuntDouble,
                   (Vector3d *)in_stack_fffffffffffffda8);
        FixedChargeAdapter::FixedChargeAdapter(local_140,local_30);
        bVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x1b1f98);
        if (bVar1) {
          local_e9 = 1;
          local_78 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_fffffffffffffda0);
        }
        FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_148,local_30);
        bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x1b1fde);
        if (bVar1) {
          local_e9 = 1;
          RVar4 = StuntDouble::getFlucQPos(in_stack_fffffffffffffda0);
          local_78 = RVar4 + local_78;
          in_stack_fffffffffffffda8 = local_28;
          dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffdb0,
                         (Vector<double,_3U> *)local_28);
          StuntDouble::addFlucQFrc
                    (&in_stack_fffffffffffffdb0->super_StuntDouble,
                     (RealType)in_stack_fffffffffffffda8);
        }
        if ((local_e9 & 1) != 0) {
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffda8,
                            (double)in_stack_fffffffffffffda0);
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffda8,
                            (double)in_stack_fffffffffffffda0);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffda8,
                     (Vector<double,_3U> *)in_stack_fffffffffffffda0);
          StuntDouble::addFrc(&in_stack_fffffffffffffdb0->super_StuntDouble,
                              (Vector3d *)in_stack_fffffffffffffda8);
          local_98 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffdb0,
                                    (Vector<double,_3U> *)in_stack_fffffffffffffda8);
          local_98 = -local_98;
          if (((ulong)in_RDI[2]._M_current & 0x10000) != 0) {
            StuntDouble::addParticlePot
                      (&in_stack_fffffffffffffdb0->super_StuntDouble,
                       (RealType *)in_stack_fffffffffffffda8);
          }
          local_a0 = (potVec *)(local_98 + (double)local_a0);
        }
        MultipoleAdapter::MultipoleAdapter(local_180,local_30);
        bVar1 = MultipoleAdapter::isDipole((MultipoleAdapter *)in_stack_fffffffffffffe08);
        if (bVar1) {
          StuntDouble::getDipole(&in_stack_fffffffffffffda8->super_StuntDouble);
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffda8,
                            (double)in_stack_fffffffffffffda0);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffda8,
                     (Vector<double,_3U> *)in_stack_fffffffffffffda0);
          cross<double>(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffda0,
                     (Vector3<double> *)in_stack_fffffffffffffd98);
          StuntDouble::addTrq(&in_stack_fffffffffffffdb0->super_StuntDouble,
                              (Vector3d *)in_stack_fffffffffffffda8);
          local_98 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffdb0,
                                    (Vector<double,_3U> *)in_stack_fffffffffffffda8);
          local_98 = -local_98;
          if (((ulong)in_RDI[2]._M_current & 0x10000) != 0) {
            StuntDouble::addParticlePot
                      (&in_stack_fffffffffffffdb0->super_StuntDouble,
                       (RealType *)in_stack_fffffffffffffda8);
          }
          local_a0 = (potVec *)(local_98 + (double)local_a0);
        }
        local_28 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffffdc0,in_RDI);
      }
      local_20 = SimInfo::nextMolecule(in_stack_fffffffffffffdc0,(MoleculeIterator *)in_RDI);
    }
    MPI_Allreduce(1,&local_a0,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
    pSVar2 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]._M_current);
    this_00 = SnapshotManager::getCurrentSnapshot(pSVar2);
    Snapshot::getLongRangePotentials(in_stack_fffffffffffffd98);
    Vector<double,_7U>::operator=
              ((Vector<double,_7U> *)in_stack_fffffffffffffda8,
               (Vector<double,_7U> *)in_stack_fffffffffffffda0);
    lrPot = local_a0;
    pdVar3 = Vector<double,_7U>::operator[](&local_68,2);
    *pdVar3 = (double)lrPot + *pdVar3;
    Vector<double,_7U>::Vector
              ((Vector<double,_7U> *)in_stack_fffffffffffffdb0,
               (Vector<double,_7U> *)in_stack_fffffffffffffda8);
    Snapshot::setLongRangePotentials(this_00,lrPot);
  }
  return;
}

Assistant:

void UniformField::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;
    potVec longRangePotential(0.0);

    RealType C;
    Vector3d D;
    RealType U;
    RealType fPot;
    Vector3d t;
    Vector3d f;
    Vector3d r;

    bool isCharge;

    if (doUniformField) {
      U    = 0.0;
      fPot = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();

          // ad-hoc choice of the origin for potential calculation and
          // fluctuating charge force:

          r = atom->getPos();
          info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

          atom->addElectricField(EF * Constants::chargeFieldConvert);

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
          if (fqa.isFluctuatingCharge()) {
            isCharge = true;
            C += atom->getFlucQPos();
            atom->addFlucQFrc(dot(r, EF) * Constants::chargeFieldConvert);
          }

          if (isCharge) {
            f = EF * C * Constants::chargeFieldConvert;
            atom->addFrc(f);
            U = -dot(r, f);

            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleFieldConvert;

            t = cross(D, EF);
            atom->addTrq(t);

            U = -dot(D, EF);

            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &fPot, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      Snapshot* snap     = info_->getSnapshotManager()->getCurrentSnapshot();
      longRangePotential = snap->getLongRangePotentials();
      longRangePotential[ELECTROSTATIC_FAMILY] += fPot;
      snap->setLongRangePotentials(longRangePotential);
    }
  }